

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.c
# Opt level: O0

void plygo(runcxdef *run,voccxdef *voc,tiocxdef *tio,objnum preinit,char *restore_fname)

{
  int iVar1;
  ushort **ppuVar2;
  short in_CX;
  long in_RSI;
  undefined8 *in_RDI;
  char *in_R8;
  errdef fr__4;
  errdef fr__3;
  char fname [256];
  char *p;
  int quiet;
  errdef fr__2;
  char buf_1 [128];
  char buf [4156];
  char *dst;
  char *src;
  char restore_buf [8192];
  errdef fr__1;
  errdef fr_;
  int inited;
  int first_time;
  char filbuf [128];
  errcxdef *ec;
  int err;
  int in_stack_ffffffffffffc728;
  uint in_stack_ffffffffffffc72c;
  int in_stack_ffffffffffffc730;
  undefined1 in_stack_ffffffffffffc734;
  undefined1 in_stack_ffffffffffffc735;
  undefined1 in_stack_ffffffffffffc736;
  undefined1 in_stack_ffffffffffffc737;
  char *in_stack_ffffffffffffc738;
  long lVar3;
  undefined4 in_stack_ffffffffffffc740;
  undefined4 in_stack_ffffffffffffc744;
  int in_stack_ffffffffffffc768;
  int in_stack_ffffffffffffc76c;
  char *in_stack_ffffffffffffc770;
  objnum in_stack_ffffffffffffc77c;
  objnum in_stack_ffffffffffffc77e;
  voccxdef *in_stack_ffffffffffffc780;
  char *in_stack_ffffffffffffc850;
  voccxdef *in_stack_ffffffffffffc858;
  int in_stack_ffffffffffffc868;
  objnum in_stack_ffffffffffffc86e;
  runcxdef *in_stack_ffffffffffffc870;
  uint in_stack_ffffffffffffc8cc;
  char *in_stack_ffffffffffffc8d0;
  voccxdef *in_stack_ffffffffffffc8d8;
  __jmp_buf_tag a_Stack_3720 [2];
  byte *local_3550;
  uint local_3544;
  long local_3540;
  int local_3538;
  undefined1 auStack_3534 [12];
  undefined1 auStack_3528 [80];
  undefined4 local_34d8;
  __jmp_buf_tag _Stack_34d0;
  char local_3408;
  byte local_3407;
  byte local_3406 [126];
  char local_3388 [4160];
  char *local_2348;
  char *local_2340;
  char local_2338 [8192];
  char acStack_338 [8];
  long local_330;
  int local_328;
  __jmp_buf_tag _Stack_2c0;
  long local_1f8;
  int local_1f0;
  __jmp_buf_tag _Stack_188;
  int local_c0;
  int local_bc;
  char local_b8 [128];
  long *local_38;
  int local_2c;
  char *local_28;
  short local_1a;
  long local_10;
  undefined8 *local_8;
  
  local_38 = (long *)*in_RDI;
  local_c0 = 0;
  local_bc = 1;
  local_28 = in_R8;
  local_1a = in_CX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  outformat((char *)CONCAT17(in_stack_ffffffffffffc737,
                             CONCAT16(in_stack_ffffffffffffc736,
                                      CONCAT15(in_stack_ffffffffffffc735,
                                               CONCAT14(in_stack_ffffffffffffc734,
                                                        in_stack_ffffffffffffc730)))));
LAB_00247237:
  if (local_c0 == 0) {
    tiosetactor(*(tiocxdef **)(local_10 + 8),*(objnum *)(local_10 + 0xf40));
    if (local_bc != 0) {
      local_bc = 0;
      *(short *)(local_10 + 0x1198) = local_1a;
      local_1f0 = _setjmp(&_Stack_188);
      if (local_1f0 == 0) {
        local_1f8 = *local_38;
        *local_38 = (long)&local_1f8;
        local_8[4] = local_8[2];
        local_8[7] = local_8[6];
        *(undefined4 *)(local_8[0xd] + 0x2c) = 0;
        *(undefined4 *)(local_8[0xd] + 0x28) = 0;
        voc_stk_ini((voccxdef *)
                    CONCAT17(in_stack_ffffffffffffc737,
                             CONCAT16(in_stack_ffffffffffffc736,
                                      CONCAT15(in_stack_ffffffffffffc735,
                                               CONCAT14(in_stack_ffffffffffffc734,
                                                        in_stack_ffffffffffffc730)))),
                    in_stack_ffffffffffffc72c);
        if (local_1a != -1) {
          runfn(in_stack_ffffffffffffc870,in_stack_ffffffffffffc86e,in_stack_ffffffffffffc868);
        }
        *local_38 = local_1f8;
        goto LAB_002473cb;
      }
      *local_38 = local_1f8;
      if (local_1f0 != 0x3fa) {
        local_2c = local_1f0;
        errrse1((errcxdef *)
                CONCAT17(in_stack_ffffffffffffc737,
                         CONCAT16(in_stack_ffffffffffffc736,
                                  CONCAT15(in_stack_ffffffffffffc735,
                                           CONCAT14(in_stack_ffffffffffffc734,
                                                    in_stack_ffffffffffffc730)))),
                (errdef *)CONCAT44(in_stack_ffffffffffffc72c,in_stack_ffffffffffffc728));
      }
      local_2c = 0x3fa;
      goto LAB_00247237;
    }
LAB_002473cb:
    if ((local_28 != (char *)0x0) && (*(short *)(local_10 + 0x1102) != -1)) goto LAB_0024751e;
    local_328 = _setjmp(&_Stack_2c0);
    if (local_328 != 0) {
      *local_38 = local_330;
      if (local_328 != 0x3fa) {
        local_2c = local_328;
        errrse1((errcxdef *)
                CONCAT17(in_stack_ffffffffffffc737,
                         CONCAT16(in_stack_ffffffffffffc736,
                                  CONCAT15(in_stack_ffffffffffffc735,
                                           CONCAT14(in_stack_ffffffffffffc734,
                                                    in_stack_ffffffffffffc730)))),
                (errdef *)CONCAT44(in_stack_ffffffffffffc72c,in_stack_ffffffffffffc728));
      }
      local_2c = 0x3fa;
      goto LAB_00247237;
    }
    local_330 = *local_38;
    *local_38 = (long)&local_330;
    local_8[4] = local_8[2];
    local_8[7] = local_8[6];
    *(undefined4 *)(local_8[0xd] + 0x2c) = 0;
    *(undefined4 *)(local_8[0xd] + 0x28) = 0;
    voc_stk_ini((voccxdef *)
                CONCAT17(in_stack_ffffffffffffc737,
                         CONCAT16(in_stack_ffffffffffffc736,
                                  CONCAT15(in_stack_ffffffffffffc735,
                                           CONCAT14(in_stack_ffffffffffffc734,
                                                    in_stack_ffffffffffffc730)))),
                in_stack_ffffffffffffc72c);
    runfn(in_stack_ffffffffffffc870,in_stack_ffffffffffffc86e,in_stack_ffffffffffffc868);
    *local_38 = local_330;
  }
LAB_0024751e:
  local_c0 = 0;
  iVar1 = os_paramfile(local_b8);
  if (iVar1 != 0) {
    local_28 = local_b8;
  }
  if (local_28 != (char *)0x0) {
    if (*(short *)(local_10 + 0x1102) == -1) {
      os_printz((char *)CONCAT17(in_stack_ffffffffffffc737,
                                 CONCAT16(in_stack_ffffffffffffc736,
                                          CONCAT15(in_stack_ffffffffffffc735,
                                                   CONCAT14(in_stack_ffffffffffffc734,
                                                            in_stack_ffffffffffffc730)))));
      local_2c = fiorso(in_stack_ffffffffffffc858,in_stack_ffffffffffffc850);
      if (local_2c != 0) {
        sprintf(local_3388,"\n\nError: unable to restore file \"%s\"\n\n",local_28);
        os_printz((char *)CONCAT17(in_stack_ffffffffffffc737,
                                   CONCAT16(in_stack_ffffffffffffc736,
                                            CONCAT15(in_stack_ffffffffffffc735,
                                                     CONCAT14(in_stack_ffffffffffffc734,
                                                              in_stack_ffffffffffffc730)))));
      }
    }
    else {
      local_2348 = local_2338;
      for (local_2340 = local_28;
          in_stack_ffffffffffffc737 = *local_2340 != '\0' && local_2348 + 2 < acStack_338,
          *local_2340 != '\0' && local_2348 + 2 < acStack_338; local_2340 = local_2340 + 1) {
        if (*local_2340 == '\\') {
          *local_2348 = '\\';
          local_2348[1] = '\\';
          local_2348 = local_2348 + 2;
        }
        else {
          *local_2348 = *local_2340;
          local_2348 = local_2348 + 1;
        }
      }
      local_8[4] = local_8[2];
      local_8[7] = local_8[6];
      *(undefined4 *)(local_8[0xd] + 0x2c) = 0;
      *(undefined4 *)(local_8[0xd] + 0x28) = 0;
      voc_stk_ini((voccxdef *)
                  CONCAT17(in_stack_ffffffffffffc737,
                           CONCAT16(in_stack_ffffffffffffc736,
                                    CONCAT15(in_stack_ffffffffffffc735,
                                             CONCAT14(in_stack_ffffffffffffc734,
                                                      in_stack_ffffffffffffc730)))),
                  in_stack_ffffffffffffc72c);
      runpstr((runcxdef *)CONCAT44(in_stack_ffffffffffffc744,in_stack_ffffffffffffc740),
              in_stack_ffffffffffffc738,
              CONCAT13(in_stack_ffffffffffffc737,
                       CONCAT12(in_stack_ffffffffffffc736,
                                CONCAT11(in_stack_ffffffffffffc735,in_stack_ffffffffffffc734))),
              in_stack_ffffffffffffc730);
      runfn(in_stack_ffffffffffffc870,in_stack_ffffffffffffc86e,in_stack_ffffffffffffc868);
    }
    local_28 = (char *)0x0;
  }
  *(undefined1 *)(local_10 + 0x56c) = 0;
  do {
    local_2c = 0;
    local_3538 = _setjmp(&_Stack_34d0);
    if (local_3538 == 0) {
      local_3540 = *local_38;
      *local_38 = (long)&local_3540;
      if (*(int *)(local_10 + 0x568) == 0) {
        outshow();
        outflush();
        local_8[4] = local_8[2];
        local_8[7] = local_8[6];
        *(undefined4 *)(local_8[0xd] + 0x2c) = 0;
        *(undefined4 *)(local_8[0xd] + 0x28) = 0;
        vocread(in_stack_ffffffffffffc780,in_stack_ffffffffffffc77e,in_stack_ffffffffffffc77c,
                in_stack_ffffffffffffc770,in_stack_ffffffffffffc76c,in_stack_ffffffffffffc768);
        if (local_3408 != '@') goto LAB_00247a00;
        local_3544 = 0;
        local_3550 = &local_3407;
        if (local_3407 == 0x40) {
          setmore(0);
          os_nonstop_mode(1);
          local_3550 = local_3550 + 1;
        }
        else {
          if (local_3407 == 0x21) {
            local_3550 = local_3406;
          }
          local_3544 = (uint)(local_3407 == 0x21);
        }
        while( true ) {
          in_stack_ffffffffffffc736 = false;
          if ((*local_3550 != 0) &&
             (in_stack_ffffffffffffc735 = false,
             in_stack_ffffffffffffc736 = in_stack_ffffffffffffc735, *local_3550 < 0x80)) {
            ppuVar2 = __ctype_b_loc();
            in_stack_ffffffffffffc735 = ((*ppuVar2)[(int)(uint)*local_3550] & 0x2000) != 0;
            in_stack_ffffffffffffc736 = in_stack_ffffffffffffc735;
          }
          if ((bool)in_stack_ffffffffffffc736 == false) break;
          local_3550 = local_3550 + 1;
        }
        if (*local_3550 == 0) {
          iVar1 = tio_askfile(in_stack_ffffffffffffc738,
                              (char *)CONCAT17(in_stack_ffffffffffffc737,
                                               (uint7)CONCAT15(in_stack_ffffffffffffc735,
                                                               CONCAT14(in_stack_ffffffffffffc734,
                                                                        in_stack_ffffffffffffc730)))
                              ,in_stack_ffffffffffffc72c,in_stack_ffffffffffffc728,0);
          if (iVar1 == 0) {
            qasopn((char *)CONCAT44(in_stack_ffffffffffffc72c,in_stack_ffffffffffffc728),0);
          }
        }
        else {
          qasopn((char *)CONCAT44(in_stack_ffffffffffffc72c,in_stack_ffffffffffffc728),0);
        }
      }
      else {
LAB_00247a00:
        if ((*(int *)(local_10 + 0x568) != 0) && (*(char *)(local_10 + 0x56c) != '\0')) {
          strcpy(&local_3408,(char *)(local_10 + 0x56c));
          *(undefined1 *)(local_10 + 0x56c) = 0;
        }
        *(undefined4 *)(local_10 + 0x568) = 0;
        os_break();
        voccmd(in_stack_ffffffffffffc8d8,in_stack_ffffffffffffc8d0,in_stack_ffffffffffffc8cc);
      }
      *local_38 = local_3540;
    }
    else {
      *local_38 = local_3540;
      local_2c = local_3538;
      if (((local_3538 != 0x3f9) && (local_3538 != 0x3fa)) &&
         ((local_3538 != 0x3f6 || (*(int *)(local_10 + 0x568) == 0)))) {
        (*(code *)local_38[1])(local_38[2],auStack_3534,local_3538,local_34d8,auStack_3528);
      }
    }
    if ((local_2c == 0x3de) && (*(long *)(local_10 + 0x20) != 0)) {
      iVar1 = _setjmp(a_Stack_3720);
      if (iVar1 == 0) {
        in_stack_ffffffffffffc870 = (runcxdef *)*local_38;
        *local_38 = (long)&stack0xffffffffffffc870;
        objundo((mcmcxdef *)
                CONCAT17(in_stack_ffffffffffffc737,
                         CONCAT16(in_stack_ffffffffffffc736,
                                  CONCAT15(in_stack_ffffffffffffc735,
                                           CONCAT14(in_stack_ffffffffffffc734,
                                                    in_stack_ffffffffffffc730)))),
                (objucxdef *)CONCAT44(in_stack_ffffffffffffc72c,in_stack_ffffffffffffc728));
        *local_38 = (long)in_stack_ffffffffffffc870;
      }
      else {
        *local_38 = (long)in_stack_ffffffffffffc870;
        local_2c = iVar1;
        if ((iVar1 != 0xc9) && (iVar1 != 0xca)) {
          errrse1((errcxdef *)
                  CONCAT17(in_stack_ffffffffffffc737,
                           CONCAT16(in_stack_ffffffffffffc736,
                                    CONCAT15(in_stack_ffffffffffffc735,
                                             CONCAT14(in_stack_ffffffffffffc734,
                                                      in_stack_ffffffffffffc730)))),
                  (errdef *)CONCAT44(in_stack_ffffffffffffc72c,in_stack_ffffffffffffc728));
        }
      }
    }
    if (local_2c == 0x3f9) {
      iVar1 = _setjmp((__jmp_buf_tag *)&stack0xffffffffffffc7a8);
      if (iVar1 == 0) {
        lVar3 = *local_38;
        *local_38 = (long)&stack0xffffffffffffc738;
        *(undefined4 *)(local_8[0xd] + 0x28) = 0;
        *(undefined4 *)(local_8[0xd] + 0x2c) = 0;
        dbguquitting((dbgcxdef *)local_8[0xd]);
        *local_38 = lVar3;
      }
      else {
        *local_38 = (long)in_stack_ffffffffffffc738;
        if (iVar1 != 0x3f9) {
          if (iVar1 != 0x3fa) {
            local_2c = iVar1;
            errrse1((errcxdef *)
                    CONCAT17(in_stack_ffffffffffffc737,
                             CONCAT16(in_stack_ffffffffffffc736,
                                      CONCAT15(in_stack_ffffffffffffc735,
                                               CONCAT14(in_stack_ffffffffffffc734,iVar1)))),
                    (errdef *)CONCAT44(in_stack_ffffffffffffc72c,in_stack_ffffffffffffc728));
          }
          in_stack_ffffffffffffc730 = 0x3fa;
          in_stack_ffffffffffffc740 = 0x3fa;
          local_2c = 0x3fa;
          break;
        }
      }
      return;
    }
  } while (local_2c != 0x3fa);
  goto LAB_00247237;
}

Assistant:

void plygo(runcxdef *run, voccxdef *voc, tiocxdef *tio, objnum preinit,
           char *restore_fname)
{
    int       err;
    errcxdef *ec = run->runcxerr;
    char      filbuf[128];
    int       first_time;
    int noreg inited = FALSE;

    NOREG((&inited));

    first_time = TRUE;

    /* 
     *   Write out the special <?T2> HTML sequence, in case we're on an HTML
     *   system.  This tells the HTML parser to use the parsing rules for
     *   TADS 2 callers. 
     */
    outformat("\\H+<?T2>\\H-");
    
startover:
    if (!inited)
    {
        /* use Me as the format-string actor for preinit and init */
        tiosetactor(voc->voccxtio, voc->voccxme);

        /*
         *   Run preinit, if it hasn't been run yet.  Note that we only
         *   do this the first time through.  If we come back here via the
         *   restart function, preinit will already have been run in the
         *   restart function itself, so we don't need to run it again.
         */
        if (first_time)
        {
            /* make a note that we've been through here once already */
            first_time = FALSE;

            /* remember the preinit function for later use in restarting */
            voc->voccxpreinit = preinit;

            /* run the preinit() function */
            ERRBEGIN(ec)
            {
                /* reset the interpreter */
                runrst(run);

                /* reset the parser */
                voc_stk_ini(voc, (uint)VOC_STACK_SIZE);

                /* run preinit */
                if (preinit != MCMONINV)
                    runfn(run, preinit, 0);
            }
            ERRCATCH(ec, err)
            {
                /* if they restarted, go back and start over */
                if (err == ERR_RUNRESTART)
                    goto startover;

                /* resignal the error */
                errrse(ec);
            }
            ERREND(ec);
        }
        
        /* 
         *   Run the "init" function.  Do NOT run init if we're restoring
         *   a game directly from the command line AND there's an
         *   initRestore function defined. 
         */
        if (restore_fname == 0 || voc->voccxinitrestore == MCMONINV)
        {
            ERRBEGIN(ec)
            {
                /* reset the interpreter */
                runrst(run);

                /* reset the parser */
                voc_stk_ini(voc, (uint)VOC_STACK_SIZE);

                /* run init */
                runfn(run, (objnum)voc->voccxini, 0);
            }
            ERRCATCH(ec, err)
            {
                /* if they restarted, go back and start over */
                if (err == ERR_RUNRESTART)
                    goto startover;
                
                /* resignal the error */
                errrse(ec);
            }
            ERREND(ec);
        }
    }
    
    /* next time through, we'll need to run init again */
    inited = FALSE;

    /* 
     *   check for startup parameter file to restore - if there's a
     *   system-specific parameter file specified, pretend that it was
     *   specified as the restore file 
     */
    if (os_paramfile(filbuf))
        restore_fname = filbuf;

    /* check for a file to restore */
    if (restore_fname != 0)
    {
        /*
         *   Check to see if the game file supports the initRestore
         *   function.  If so, call it to restore the game.  If not,
         *   restore the game directly. 
         */
        if (voc->voccxinitrestore != MCMONINV)
        {
            char restore_buf[OSFNMAX*2];
            char *src;
            char *dst;
            
            /* convert any backslashes to double backslashes */
            for (src = restore_fname, dst = restore_buf ;
                 *src != '\0' && dst + 2 < restore_buf + sizeof(restore_buf) ;
                 ++src)
            {
                switch(*src)
                {
                case '\\':
                    /* it's a backslash - double it */
                    *dst++ = '\\';
                    *dst++ = '\\';
                    break;

                default:
                    /* copy the character as-is */
                    *dst++ = *src;
                }
            }
            
            /* 
             *   all the game's initRestore function with the name of
             *   saved game file to restore as the argument 
             */

            /* reset the interpreter */
            runrst(run);

            /* reset the parser */
            voc_stk_ini(voc, (uint)VOC_STACK_SIZE);

            /* push the game file name and run initRestore */
            runpstr(run, restore_buf, dst - restore_buf, 0);
            runfn(run, (objnum)voc->voccxinitrestore, 1);
        }
        else
        {
            /* restore the game */
            os_printz("\n\n[Restoring saved game]\n\n");
            err = fiorso(voc, restore_fname);
            if (err)
            {
                char buf[60 + OSFNMAX];

                sprintf(buf, "\n\nError: unable to restore file \"%s\"\n\n",
                        restore_fname);
                os_printz(buf);
            }
        }

        /* forget the saved game name, in case we restore */
        restore_fname = 0;
    }

    /* clear out the redo command buffer */
    voc->voccxredobuf[0] = '\0';
    
    /* read and execute commands */
    for (;;)
    {
        char buf[128];
        
        err = 0;
        ERRBEGIN(ec)
            
        /* read a new command if there's nothing to redo */
        if (!voc->voccxredo)
        {
            /* reset hidden output so we're showing output */
            tioshow(tio);
            tioflush(tio);

            /* clear the interpreter stack */
            runrst(run);

            /* read a command */
            vocread(voc, MCMONINV, MCMONINV, buf, (int)sizeof(buf), 0);

            /* special qa checking */
            if (buf[0] == '@')
            {
                int   quiet = FALSE;
                char *p;
                
                p = buf + 1;
                if (*p == '@')
                {
                    /* turn off MORE mode */
                    setmore(0);

                    /* set NONSTOP mode in the OS layer */
                    os_nonstop_mode(TRUE);

                    /* skip the extra '@' */
                    ++p;
                }
                else if (*p == '!')
                {
                    quiet = TRUE;
                    ++p;
                }
                while (*p != '\0' && t_isspace(*p)) ++p;
                if (*p != '\0')
                {
                    /* open the named file */
                    qasopn(p, quiet);
                }
                else
                {
                    char fname[256];

                    /* no file was named - ask the user to select a file */
                    if (tio_askfile("Read script file:", fname, sizeof(fname),
                                    OS_AFP_OPEN, OSFTCMD) == 0)
                        qasopn(fname, quiet);
                }
                goto end_loop;
            }
        }

        /* 
         *   If there's redo in the redo buffer, use it now.  If the
         *   buffer is empty and the redo flag is set, we'll just
         *   re-execute whatever's in our internal buffer.
         */
        if (voc->voccxredo && voc->voccxredobuf[0] != '\0')
        {
            /* copy the redo buffer into our internal buffer */
            strcpy(buf, voc->voccxredobuf);

            /* we've consumed it now, so clear it out */
            voc->voccxredobuf[0] = '\0';
        }

        /* we've now consumed the redo */
        voc->voccxredo = FALSE;

        /* clear any pending break that's queued up */
        (void)os_break();

        /* execute the command */
        (void)voccmd(voc, buf, (uint)sizeof(buf));
        
    end_loop:
        ERRCATCH(ec, err)
        {
            if (err != ERR_RUNQUIT
                && err != ERR_RUNRESTART
                && !(err == ERR_RUNABRT && voc->voccxredo))
                errclog(ec);
        }
        ERREND(ec);

        /* on interrupt, undo last command (which was partially executed) */
        if (err == ERR_USRINT && voc->voccxundo)
        {
            ERRBEGIN(ec)
                objundo(voc->voccxmem, voc->voccxundo);
            ERRCATCH(ec, err)
                if (err != ERR_NOUNDO && err != ERR_ICUNDO)
                    errrse(ec);
            ERREND(ec)
        }
            
        /* if they want to quit, we're done */
        if (err == ERR_RUNQUIT)
            break;
        else if (err == ERR_RUNRESTART)
            goto startover;
    }

    /*
     *   If we're quitting, give the debugger one last chance at taking
     *   control.  If it just returns, we can go ahead and terminate, but
     *   if it wants it can restart the game by calling bifrst() as
     *   normal.  
     */
    ERRBEGIN(ec)
    {
        /* clear anything in the debugger stack trace */
        run->runcxdbg->dbgcxfcn = 0;
        run->runcxdbg->dbgcxdep = 0;

        /* tell the debugger the game has exited */
        dbguquitting(run->runcxdbg);
    }
    ERRCATCH(ec, err)
    {
        switch(err)
        {
        case ERR_RUNRESTART:
            /* they restarted the game - re-enter the play loop */
            goto startover;

        case ERR_RUNQUIT:
            /* quitting - proceed to return as normal */
            break;

        default:
            /* resignal any other error */
            errrse(ec);
        }
    }
    ERREND(ec);
}